

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O1

Test * BuildWithLogTestImplicitGeneratedOutOfDate::Create(void)

{
  BuildWithLogTest *this;
  
  this = (BuildWithLogTest *)operator_new(0x4c8);
  BuildWithLogTest::BuildWithLogTest(this);
  (this->super_BuildTest).super_StateTestWithBuiltinRules.super_Test._vptr_Test =
       (_func_int **)&PTR__BuildWithLogTest_001f5648;
  (this->super_BuildTest).super_BuildLogUser._vptr_BuildLogUser = (_func_int **)&DAT_001f5688;
  g_current_test = (Test *)this;
  return (Test *)this;
}

Assistant:

TEST_F(BuildWithLogTest, ImplicitGeneratedOutOfDate) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule touch\n"
"  command = touch $out\n"
"  generator = 1\n"
"build out.imp: touch | in\n"));
  fs_.Create("out.imp", "");
  fs_.Tick();
  fs_.Create("in", "");

  string err;

  EXPECT_TRUE(builder_.AddTarget("out.imp", &err));
  EXPECT_FALSE(builder_.AlreadyUpToDate());

  EXPECT_TRUE(GetNode("out.imp")->dirty());
}